

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O1

void __thiscall
TPZSparseBlockDiagonal<long_double>::TPZSparseBlockDiagonal
          (TPZSparseBlockDiagonal<long_double> *this,TPZVec<long> *blockgraph,
          TPZVec<long> *blockgraphindex,int64_t rows)

{
  long newsize;
  TPZVec<int> *this_00;
  long *plVar1;
  int *piVar2;
  long lVar3;
  
  TPZBlockDiagonal<long_double>::TPZBlockDiagonal
            (&this->super_TPZBlockDiagonal<long_double>,&PTR_PTR_0187fed8);
  (this->super_TPZBlockDiagonal<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZSparseBlockDiagonal_0187fc58;
  TPZVec<long>::TPZVec(&this->fBlock,blockgraph);
  TPZVec<long>::TPZVec(&this->fBlockIndex,blockgraphindex);
  lVar3 = blockgraphindex->fNElements;
  newsize = lVar3 + -1;
  this_00 = &(this->super_TPZBlockDiagonal<long_double>).fBlockSize;
  TPZVec<int>::Resize(this_00,newsize);
  if (1 < lVar3) {
    plVar1 = blockgraphindex->fStore;
    piVar2 = (this->super_TPZBlockDiagonal<long_double>).fBlockSize.fStore;
    lVar3 = 0;
    do {
      piVar2[lVar3] = (int)plVar1[lVar3 + 1] - (int)plVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (newsize != lVar3);
  }
  TPZBlockDiagonal<long_double>::Initialize(&this->super_TPZBlockDiagonal<long_double>,this_00);
  (this->super_TPZBlockDiagonal<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow
       = rows;
  (this->super_TPZBlockDiagonal<long_double>).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol
       = rows;
  return;
}

Assistant:

TPZSparseBlockDiagonal<TVar>::TPZSparseBlockDiagonal(TPZVec<int64_t> &blockgraph, TPZVec<int64_t> &blockgraphindex,int64_t rows) : TPZRegisterClassId(&TPZSparseBlockDiagonal::ClassId), fBlock(blockgraph), fBlockIndex(blockgraphindex)
{
	int64_t numbl = blockgraphindex.NElements()-1;
	this->fBlockSize.Resize(numbl);
	int64_t ibl;
	for(ibl=0; ibl<numbl; ibl++)
	{
		this->fBlockSize[ibl] = blockgraphindex[ibl+1]-blockgraphindex[ibl];
	}
	this->Initialize(this->fBlockSize);
	this->fRow = rows;
	this->fCol = rows;
}